

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScaleProcess.cpp
# Opt level: O0

void __thiscall Assimp::ScaleProcess::SetupProperties(ScaleProcess *this,Importer *pImp)

{
  ai_real aVar1;
  float importerScale;
  Importer *pImp_local;
  ScaleProcess *this_local;
  
  aVar1 = Importer::GetPropertyFloat(pImp,"GLOBAL_SCALE_FACTOR",1.0);
  this->mScale = aVar1;
  aVar1 = Importer::GetPropertyFloat(pImp,"APP_SCALE_FACTOR",1.0);
  this->mScale = aVar1 * this->mScale;
  return;
}

Assistant:

void ScaleProcess::SetupProperties( const Importer* pImp ) {
    // User scaling
    mScale = pImp->GetPropertyFloat( AI_CONFIG_GLOBAL_SCALE_FACTOR_KEY, 1.0f );

    // File scaling * Application Scaling
    float importerScale = pImp->GetPropertyFloat( AI_CONFIG_APP_SCALE_KEY, 1.0f );

    // apply scale to the scale 
    // helps prevent bugs with backward compatibility for anyone using normal scaling.
    mScale *= importerScale;
}